

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O2

int greatest_name_match(char *name,char *filter,int res_if_none)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  
  if (filter == (char *)0x0) {
    return res_if_none;
  }
  __n = strlen(filter);
  if (__n == 0) {
    return res_if_none;
  }
  if ((greatest_info.exact_name_match == '\0') || (sVar2 = strlen(name), sVar2 == __n)) {
    for (; *name != '\0'; name = name + 1) {
      if ((*name == *filter) && (iVar1 = strncmp(name,filter,__n), iVar1 == 0)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}